

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

bool __thiscall
cmFileInstaller::InstallFile
          (cmFileInstaller *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  byte unaff_BPL;
  bool bVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string newFromFile;
  string reassembled;
  string toDir;
  string e;
  string oldSymlinkTarget;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  char *local_d0;
  undefined8 local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  string *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  if (this->InstallMode == COPY) {
    bVar5 = cmFileCopier::InstallFile(&this->super_cmFileCopier,fromFile,toFile,match_properties);
    return bVar5;
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  if (this->InstallMode - REL_SYMLINK < 4) {
    cmsys::SystemTools::GetParentDirectory(&local_130,toFile);
    cmSystemTools::ForceToRelativePath(&local_f0,&local_130,fromFile);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CollapseFullPath(&local_150,&local_170,&local_130);
    bVar2 = cmsys::SystemTools::ComparePath(&local_150,fromFile);
    bVar5 = true;
    if (!bVar2) {
      if (this->InstallMode - SYMLINK < 2) {
        std::__cxx11::string::_M_assign((string *)&local_170);
      }
      else if (this->InstallMode == REL_SYMLINK_OR_COPY) {
        unaff_BPL = cmFileCopier::InstallFile
                              (&this->super_cmFileCopier,fromFile,toFile,match_properties);
        bVar5 = false;
      }
      else {
        pcVar1 = (this->super_cmFileCopier).Name;
        local_f0._M_dataplus._M_p = (pointer)strlen(pcVar1);
        local_f0.field_2._M_allocated_capacity = 0;
        local_f0.field_2._8_8_ = 0x30;
        local_d0 = " cannot determine relative path for symlink to \"";
        local_c8 = 0;
        local_c0 = (char *)local_170._M_string_length;
        local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_170._M_dataplus._M_p;
        local_b0 = 0;
        local_a8 = 6;
        local_a0 = "\" at \"";
        local_98 = 0;
        local_88 = (toFile->_M_dataplus)._M_p;
        local_90 = toFile->_M_string_length;
        local_80 = 0;
        local_78 = 2;
        local_70 = "\".";
        local_68 = 0;
        views._M_len = 6;
        views._M_array = (iterator)&local_f0;
        local_f0._M_string_length = (size_type)pcVar1;
        cmCatViews(&local_110,views);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        bVar5 = false;
        unaff_BPL = 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_005cdc77;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_170);
  }
  bVar5 = true;
  if ((this->super_cmFileCopier).Always == false) {
    local_f0._M_string_length = 0;
    local_f0.field_2._M_allocated_capacity =
         local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    SVar4 = cmsys::SystemTools::ReadSymlink(toFile,&local_f0);
    bVar5 = true;
    if ((SVar4.Kind_ == Success) && (local_170._M_string_length == local_f0._M_string_length)) {
      if ((char *)local_170._M_string_length == (char *)0x0) {
        bVar5 = false;
      }
      else {
        iVar3 = bcmp(local_170._M_dataplus._M_p,local_f0._M_dataplus._M_p,local_170._M_string_length
                    );
        bVar5 = iVar3 != 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  (*(this->super_cmFileCopier)._vptr_cmFileCopier[5])(this,toFile,2,(ulong)bVar5);
  unaff_BPL = 1;
  if (bVar5 != false) {
    cmsys::SystemTools::RemoveFile(toFile);
    cmsys::SystemTools::GetFilenamePath(&local_f0,toFile);
    cmsys::SystemTools::MakeDirectory(&local_f0,(mode_t *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    SVar4 = cmSystemTools::CreateSymlink(&local_170,toFile);
    if (SVar4.Kind_ != Success) {
      if ((this->InstallMode < (SYMLINK_OR_COPY|ABS_SYMLINK)) &&
         ((0x54U >> (this->InstallMode & 0x1f) & 1) != 0)) {
        unaff_BPL = cmFileCopier::InstallFile
                              (&this->super_cmFileCopier,&local_170,toFile,match_properties);
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        pcVar1 = (this->super_cmFileCopier).Name;
        local_f0._M_dataplus._M_p = (pointer)strlen(pcVar1);
        local_f0.field_2._M_allocated_capacity = 0;
        local_f0.field_2._8_8_ = 0x1b;
        local_d0 = " cannot create symlink to \"";
        local_c8 = 0;
        local_c0 = (char *)local_170._M_string_length;
        local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_170._M_dataplus._M_p;
        local_b0 = 0;
        local_a8 = 6;
        local_a0 = "\" at \"";
        local_98 = 0;
        local_88 = (toFile->_M_dataplus)._M_p;
        local_90 = toFile->_M_string_length;
        local_80 = 0;
        local_78 = 3;
        local_70 = "\": ";
        local_68 = 0;
        local_60 = local_150._M_string_length;
        local_58 = local_150._M_dataplus._M_p;
        local_48 = 2;
        local_40 = "\".";
        local_38 = 0;
        views_00._M_len = 8;
        views_00._M_array = (iterator)&local_f0;
        local_f0._M_string_length = (size_type)pcVar1;
        local_50 = &local_150;
        cmCatViews(&local_130,views_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        unaff_BPL = 0;
      }
    }
  }
LAB_005cdc77:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool cmFileInstaller::InstallFile(const std::string& fromFile,
                                  const std::string& toFile,
                                  MatchProperties match_properties)
{
  if (this->InstallMode == cmInstallMode::COPY) {
    return this->cmFileCopier::InstallFile(fromFile, toFile, match_properties);
  }

  std::string newFromFile;

  if (this->InstallMode == cmInstallMode::REL_SYMLINK ||
      this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
      this->InstallMode == cmInstallMode::SYMLINK ||
      this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
    // Try to get a relative path.
    std::string toDir = cmSystemTools::GetParentDirectory(toFile);
    newFromFile = cmSystemTools::ForceToRelativePath(toDir, fromFile);

    // Double check that we can restore the original path.
    std::string reassembled =
      cmSystemTools::CollapseFullPath(newFromFile, toDir);
    if (!cmSystemTools::ComparePath(reassembled, fromFile)) {
      if (this->InstallMode == cmInstallMode::SYMLINK ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // User does not mind, silently proceed with absolute path.
        newFromFile = fromFile;
      } else if (this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY) {
        // User expects a relative symbolic link or a copy.
        // Since an absolute symlink won't do, copy instead.
        return this->cmFileCopier::InstallFile(fromFile, toFile,
                                               match_properties);
      } else {
        // We cannot meet user's expectation (REL_SYMLINK)
        auto e = cmStrCat(this->Name,
                          " cannot determine relative path for symlink to \"",
                          newFromFile, "\" at \"", toFile, "\".");
        this->Status.SetError(e);
        return false;
      }
    }
  } else {
    newFromFile = fromFile; // stick with absolute path
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (newFromFile == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(newFromFile, toFile)) {
      if (this->InstallMode == cmInstallMode::ABS_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // Failed to create a symbolic link, fall back to copying.
        return this->cmFileCopier::InstallFile(newFromFile, toFile,
                                               match_properties);
      }

      auto e = cmStrCat(this->Name, " cannot create symlink to \"",
                        newFromFile, "\" at \"", toFile,
                        "\": ", cmSystemTools::GetLastSystemError(), "\".");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}